

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.cc
# Opt level: O1

bool validate_fdb_config(fdb_config *fconfig)

{
  if (fconfig == (fdb_config *)0x0) {
    __assert_fail("fconfig",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/configuration.cc"
                  ,0x91,"bool validate_fdb_config(fdb_config *)");
  }
  if (((((0xffc6 < (ushort)(fconfig->chunksize - 0x41)) &&
        (0xfffe03fe < fconfig->blocksize - 0x20001)) && (fconfig->seqtree_opt < 2)) &&
      (((fconfig->durability_opt < 4 && ((~fconfig->flags & 3) != 0)) &&
       ((fconfig->compaction_threshold < 0x65 &&
        ((fconfig->compactor_sleep_duration != 0 &&
         (0xfdff < (*(int *)&fconfig->num_wal_partitions - 0x201U & 0xffff))))))))) &&
     ((0xfdff < (ushort)(fconfig->num_bcache_partitions - 0x201) &&
      ((((0xffffffffffffffae < fconfig->max_writer_lock_prob - 0x65 &&
         (0xffffffffffffff7f < fconfig->num_compactor_threads - 0x81)) &&
        (fconfig->num_bgflusher_threads < 0x41)) && (fconfig->num_keeping_headers != 0)))))) {
    return fconfig->log_msg_level < 7;
  }
  return false;
}

Assistant:

bool validate_fdb_config(fdb_config *fconfig) {
    assert(fconfig);

    if (fconfig->chunksize < 4 || fconfig->chunksize > 64) {
        // Chunk size should be set between 4 and 64 bytes.
        return false;
    }
    if (fconfig->chunksize < sizeof(void *)) {
        // Chunk size should be equal to or greater than the address bus size
        return false;
    }
    if (fconfig->blocksize < 1024 || fconfig->blocksize > 131072) {
        // Block size should be set between 1KB and 128KB
        return false;
    }
    if (fconfig->seqtree_opt != FDB_SEQTREE_NOT_USE &&
        fconfig->seqtree_opt != FDB_SEQTREE_USE) {
        return false;
    }
    if (fconfig->durability_opt != FDB_DRB_NONE &&
        fconfig->durability_opt != FDB_DRB_ODIRECT &&
        fconfig->durability_opt != FDB_DRB_ASYNC &&
        fconfig->durability_opt != FDB_DRB_ODIRECT_ASYNC) {
        return false;
    }
    if ((fconfig->flags & FDB_OPEN_FLAG_CREATE) &&
        (fconfig->flags & FDB_OPEN_FLAG_RDONLY)) {
        return false;
    }
    if (fconfig->compaction_threshold > 100) {
        // Compaction threshold should be equal or less then 100 (%).
        return false;
    }
    if (fconfig->compactor_sleep_duration == 0) {
        // Sleep duration should be larger than zero
        return false;
    }
    if (!fconfig->num_wal_partitions ||
        (fconfig->num_wal_partitions > MAX_NUM_WAL_PARTITIONS)) {
        return false;
    }
    if (!fconfig->num_bcache_partitions ||
        (fconfig->num_bcache_partitions > MAX_NUM_BCACHE_PARTITIONS)) {
        return false;
    }
    if (fconfig->max_writer_lock_prob < 20 ||
        fconfig->max_writer_lock_prob > 100) {
        return false;
    }
    if (fconfig->num_compactor_threads < 1 ||
        fconfig->num_compactor_threads > MAX_NUM_COMPACTOR_THREADS) {
        return false;
    }
    if (fconfig->num_bgflusher_threads > MAX_NUM_BGFLUSHER_THREADS) {
        return false;
    }
    if (fconfig->num_keeping_headers == 0) {
        // num_keeping_headers should be greater than zero
        return false;
    }
    if (fconfig->log_msg_level > 6) {
        // Log level: 0 to 6.
        return false;
    }

    return true;
}